

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O1

void __thiscall
Assimp::X3DExporter::Export_Material(X3DExporter *this,size_t pIdxMaterial,size_t pTabLevel)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined1 *puVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pcVar5;
  aiMaterial *pMat;
  bool bVar6;
  size_t pTabLevel_00;
  char cVar7;
  aiReturn aVar8;
  mapped_type *pmVar9;
  _Node *p_Var10;
  undefined8 *puVar11;
  Logger *this_00;
  long *plVar12;
  _Base_ptr p_Var13;
  size_type *psVar14;
  _Base_ptr p_Var15;
  aiVector2D aVar16;
  char cVar17;
  undefined1 *puVar18;
  undefined8 uVar19;
  _Alloc_hider _Var20;
  X3DExporter *pXVar21;
  aiVector2D aVar22;
  byte bVar23;
  float tvalf;
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> attr_list;
  anon_class_8_1_15d7a4cc RepeatToAttrList;
  aiColor4D color4;
  aiColor3D color3;
  anon_class_16_2_65aab299 Color4ToAttrList;
  string material_name;
  string __str;
  aiString ai_mat_name;
  ai_real local_934;
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  local_930;
  aiColor3D local_918;
  undefined1 local_908 [8];
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  *plStack_900;
  undefined1 local_8f8 [16];
  aiColor3D local_8e8;
  undefined1 local_8d8 [16];
  SAttribute local_8c8;
  size_t local_888;
  _Base_ptr local_880;
  float local_874;
  float local_870;
  float local_86c;
  _Alloc_hider local_868;
  long local_860;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_858;
  undefined1 local_848 [5];
  undefined1 auStack_843 [3];
  IOStream *pIStack_840;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_838;
  _Alloc_hider local_828;
  char local_818 [992];
  undefined1 local_438 [32];
  _Alloc_hider local_418;
  char local_408 [984];
  
  local_930._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_930;
  local_930._M_impl._M_node._M_size = 0;
  p_Var1 = &(this->mDEF_Map_Material)._M_t._M_impl.super__Rb_tree_header;
  p_Var15 = (this->mDEF_Map_Material)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var13 = &p_Var1->_M_header;
  for (; p_Var15 != (_Base_ptr)0x0;
      p_Var15 = (&p_Var15->_M_left)[*(ulong *)(p_Var15 + 1) < pIdxMaterial]) {
    if (*(ulong *)(p_Var15 + 1) >= pIdxMaterial) {
      p_Var13 = p_Var15;
    }
  }
  p_Var15 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var13 != p_Var1) &&
     (p_Var15 = p_Var13, pIdxMaterial < *(ulong *)(p_Var13 + 1))) {
    p_Var15 = &p_Var1->_M_header;
  }
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_438 + 0x10);
  local_930._M_impl._M_node.super__List_node_base._M_prev =
       local_930._M_impl._M_node.super__List_node_base._M_next;
  local_880 = (_Base_ptr)pIdxMaterial;
  local_438._0_8_ = paVar4;
  if ((_Rb_tree_header *)p_Var15 == p_Var1) {
    pMat = this->mScene->mMaterials[pIdxMaterial];
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"_IDX_","");
    p_Var15 = local_880;
    cVar17 = '\x01';
    if ((_Base_ptr)0x9 < local_880) {
      p_Var13 = local_880;
      cVar7 = '\x04';
      do {
        cVar17 = cVar7;
        if (p_Var13 < (_Base_ptr)&DAT_00000064) {
          cVar17 = cVar17 + -2;
          goto LAB_006d55da;
        }
        if (p_Var13 < (_Base_ptr)0x3e8) {
          cVar17 = cVar17 + -1;
          goto LAB_006d55da;
        }
        if (p_Var13 < (_Base_ptr)&DAT_00002710) goto LAB_006d55da;
        bVar6 = (_Base_ptr)0x1869f < p_Var13;
        p_Var13 = (_Base_ptr)((ulong)p_Var13 / 10000);
        cVar7 = cVar17 + '\x04';
      } while (bVar6);
      cVar17 = cVar17 + '\x01';
    }
LAB_006d55da:
    local_888 = pTabLevel;
    _local_848 = (aiVector2D)&local_838;
    std::__cxx11::string::_M_construct((ulong)local_848,cVar17);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)_local_848,(uint)pIStack_840._0_4_,(unsigned_long)p_Var15);
    puVar3 = (undefined1 *)((long)&pIStack_840->_vptr_IOStream + local_438._8_8_);
    puVar18 = &DAT_0000000f;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._0_8_ != paVar4) {
      puVar18 = (undefined1 *)local_438._16_8_;
    }
    if (puVar18 < puVar3) {
      uVar19 = &DAT_0000000f;
      if (_local_848 != (aiVector2D)&local_838) {
        uVar19 = local_838._M_allocated_capacity;
      }
      if ((ulong)uVar19 < puVar3) goto LAB_006d5665;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_848,0,(char *)0x0,local_438._0_8_);
    }
    else {
LAB_006d5665:
      puVar11 = (undefined8 *)std::__cxx11::string::_M_append(local_438,(ulong)_local_848);
    }
    local_868._M_p = (pointer)&local_858;
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 == paVar2) {
      local_858._M_allocated_capacity = paVar2->_M_allocated_capacity;
      local_858._8_8_ = puVar11[3];
    }
    else {
      local_858._M_allocated_capacity = paVar2->_M_allocated_capacity;
      local_868._M_p = (pointer)*puVar11;
    }
    local_860 = puVar11[1];
    *puVar11 = paVar2;
    puVar11[1] = 0;
    paVar2->_M_local_buf[0] = '\0';
    if (_local_848 != (aiVector2D)&local_838) {
      operator_delete((void *)_local_848);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._0_8_ != paVar4) {
      operator_delete((void *)local_438._0_8_);
    }
    local_438._0_8_ = local_438._0_8_ & 0xffffff0000000000;
    memset(local_438 + 5,0x1b,0x3ff);
    aVar8 = aiGetMaterialString(pMat,"?mat.name",0,0,(aiString *)local_438);
    if (aVar8 == aiReturn_SUCCESS) {
      strlen(local_438 + 4);
      std::__cxx11::string::replace((ulong)&local_868,0,(char *)0x0,(ulong)(local_438 + 4));
    }
    _local_848 = (aiVector2D)&local_838;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"DEF","");
    local_828._M_p = local_818;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_828,local_868._M_p,local_868._M_p + local_860);
    p_Var10 = std::__cxx11::
              list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
              ::_M_create_node<Assimp::X3DExporter::SAttribute>
                        ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_930,(SAttribute *)local_848);
    std::__detail::_List_node_base::_M_hook(&p_Var10->super__List_node_base);
    local_930._M_impl._M_node._M_size = local_930._M_impl._M_node._M_size + 1;
    if (local_828._M_p != local_818) {
      operator_delete(local_828._M_p);
    }
    if (_local_848 != (aiVector2D)&local_838) {
      operator_delete((void *)_local_848);
    }
    pmVar9 = std::
             map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->mDEF_Map_Material,(key_type_conflict1 *)&local_880);
    std::__cxx11::string::_M_assign((string *)pmVar9);
    _local_848 = (aiVector2D)&local_838;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"Appearance","");
    NodeHelper_OpenNode(this,(string *)local_848,local_888,false,
                        (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&local_930);
    if (_local_848 != (aiVector2D)&local_838) {
      operator_delete((void *)_local_848);
    }
    std::__cxx11::
    _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    _M_clear(&local_930);
    local_930._M_impl._M_node._M_size = 0;
    local_8e8.r = 0.0;
    local_8e8.g = 0.0;
    local_8e8.b = 0.0;
    local_908 = (undefined1  [8])0x0;
    plStack_900 = (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                   *)0x0;
    local_848._0_4_ = 0.0;
    stack0xfffffffffffff7bc = 0.0;
    pIStack_840 = (IOStream *)0x0;
    local_930._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_930;
    local_930._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_930;
    local_8c8.Name._M_dataplus._M_p = (pointer)this;
    local_8c8.Name._M_string_length = (size_type)&local_930;
    aVar8 = aiGetMaterialColor(pMat,"$clr.ambient",0,0,(aiColor4D *)local_848);
    local_8e8._0_8_ = _local_848;
    local_8e8.b = pIStack_840._0_4_;
    if (aVar8 == aiReturn_SUCCESS) {
      local_874 = stack0xfffffffffffff7bc;
      local_870 = pIStack_840._0_4_;
      local_86c = (float)local_848._0_4_;
      pXVar21 = (X3DExporter *)local_848;
      _local_848 = (aiVector2D)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)pXVar21,"ambientIntensity","");
      AttrHelper_FloatToAttrList
                (pXVar21,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_930,(string *)local_848,(local_86c + local_874 + local_870) / 3.0
                 ,0.2);
LAB_006d59e4:
      if (_local_848 != (aiVector2D)&local_838) {
        operator_delete((void *)_local_848);
      }
    }
    else {
      aVar8 = aiGetMaterialColor(pMat,"$clr.ambient",0,0,(aiColor4D *)local_908);
      if (aVar8 == aiReturn_SUCCESS) {
        pXVar21 = (X3DExporter *)local_848;
        _local_848 = (aiVector2D)&local_838;
        std::__cxx11::string::_M_construct<char_const*>((string *)pXVar21,"ambientIntensity","");
        AttrHelper_FloatToAttrList
                  (pXVar21,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                            *)&local_930,(string *)local_848,
                   ((float)local_908._0_4_ + (float)local_908._4_4_ + plStack_900._0_4_) / 3.0,0.2);
        goto LAB_006d59e4;
      }
    }
    local_848._0_4_ = 0.0;
    stack0xfffffffffffff7bc = 0.0;
    pIStack_840 = (IOStream *)0x0;
    aVar8 = aiGetMaterialColor(pMat,"$clr.diffuse",0,0,(aiColor4D *)local_848);
    local_8e8.r = (ai_real)local_848._0_4_;
    local_8e8.g = stack0xfffffffffffff7bc;
    local_8e8.b = pIStack_840._0_4_;
    if (aVar8 == aiReturn_SUCCESS) {
      pXVar21 = (X3DExporter *)local_848;
      _local_848 = (aiVector2D)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)pXVar21,"diffuseColor","");
      local_918._0_8_ = (_List_node_base *)0x3f4ccccd3f4ccccd;
      local_918.b = 0.8;
      AttrHelper_Color3ToAttrList
                (pXVar21,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_930,(string *)local_848,&local_8e8,&local_918);
LAB_006d5af7:
      if (_local_848 != (aiVector2D)&local_838) {
        operator_delete((void *)_local_848);
      }
    }
    else {
      aVar8 = aiGetMaterialColor(pMat,"$clr.diffuse",0,0,(aiColor4D *)local_908);
      if (aVar8 == aiReturn_SUCCESS) {
        _local_848 = (aiVector2D)&local_838;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"diffuseColor","");
        local_918._0_8_ = (_List_node_base *)0x3f4ccccd3f4ccccd;
        local_918.b = 0.8;
        Export_Material::anon_class_16_2_65aab299::operator()
                  ((anon_class_16_2_65aab299 *)&local_8c8,(string *)local_848,(aiColor4D *)local_908
                   ,&local_918);
        goto LAB_006d5af7;
      }
    }
    local_848._0_4_ = 0.0;
    stack0xfffffffffffff7bc = 0.0;
    pIStack_840 = (IOStream *)0x0;
    aVar8 = aiGetMaterialColor(pMat,"$clr.emissive",0,0,(aiColor4D *)local_848);
    local_8e8.r = (ai_real)local_848._0_4_;
    local_8e8.g = stack0xfffffffffffff7bc;
    local_8e8.b = pIStack_840._0_4_;
    if (aVar8 == aiReturn_SUCCESS) {
      pXVar21 = (X3DExporter *)local_848;
      _local_848 = (aiVector2D)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)pXVar21,"emissiveColor","");
      local_918._0_8_ = (_List_node_base *)0x0;
      local_918.b = 0.0;
      AttrHelper_Color3ToAttrList
                (pXVar21,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_930,(string *)local_848,&local_8e8,&local_918);
LAB_006d5bfe:
      if (_local_848 != (aiVector2D)&local_838) {
        operator_delete((void *)_local_848);
      }
    }
    else {
      aVar8 = aiGetMaterialColor(pMat,"$clr.emissive",0,0,(aiColor4D *)local_908);
      if (aVar8 == aiReturn_SUCCESS) {
        _local_848 = (aiVector2D)&local_838;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"emissiveColor","");
        local_918._0_8_ = (_List_node_base *)0x0;
        local_918.b = 0.0;
        Export_Material::anon_class_16_2_65aab299::operator()
                  ((anon_class_16_2_65aab299 *)&local_8c8,(string *)local_848,(aiColor4D *)local_908
                   ,&local_918);
        goto LAB_006d5bfe;
      }
    }
    aVar8 = aiGetMaterialFloatArray(pMat,"$mat.shininess",0,0,&local_934,(uint *)0x0);
    if (aVar8 == aiReturn_SUCCESS) {
      pXVar21 = (X3DExporter *)local_848;
      _local_848 = (aiVector2D)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)pXVar21,"shininess","");
      AttrHelper_FloatToAttrList
                (pXVar21,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_930,(string *)local_848,local_934,0.2);
      if (_local_848 != (aiVector2D)&local_838) {
        operator_delete((void *)_local_848);
      }
    }
    local_848._0_4_ = 0.0;
    stack0xfffffffffffff7bc = 0.0;
    pIStack_840 = (IOStream *)0x0;
    aVar8 = aiGetMaterialColor(pMat,"$clr.specular",0,0,(aiColor4D *)local_848);
    local_8e8.r = (ai_real)local_848._0_4_;
    local_8e8.g = stack0xfffffffffffff7bc;
    local_8e8.b = pIStack_840._0_4_;
    if (aVar8 == aiReturn_SUCCESS) {
      pXVar21 = (X3DExporter *)local_848;
      _local_848 = (aiVector2D)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)pXVar21,"specularColor","");
      local_918._0_8_ = (_List_node_base *)0x0;
      local_918.b = 0.0;
      AttrHelper_Color3ToAttrList
                (pXVar21,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_930,(string *)local_848,&local_8e8,&local_918);
LAB_006d5d74:
      if (_local_848 != (aiVector2D)&local_838) {
        operator_delete((void *)_local_848);
      }
    }
    else {
      aVar8 = aiGetMaterialColor(pMat,"$clr.specular",0,0,(aiColor4D *)local_908);
      if (aVar8 == aiReturn_SUCCESS) {
        _local_848 = (aiVector2D)&local_838;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"specularColor","");
        local_918._0_8_ = (_List_node_base *)0x0;
        local_918.b = 0.0;
        Export_Material::anon_class_16_2_65aab299::operator()
                  ((anon_class_16_2_65aab299 *)&local_8c8,(string *)local_848,(aiColor4D *)local_908
                   ,&local_918);
        goto LAB_006d5d74;
      }
    }
    aVar8 = aiGetMaterialFloatArray(pMat,"$mat.opacity",0,0,&local_934,(uint *)0x0);
    if (aVar8 == aiReturn_SUCCESS) {
      if (1.0 < local_934) {
        local_934 = 1.0;
      }
      local_934 = 1.0 - local_934;
      pXVar21 = (X3DExporter *)local_848;
      _local_848 = (aiVector2D)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)pXVar21,"transparency","");
      AttrHelper_FloatToAttrList
                (pXVar21,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_930,(string *)local_848,local_934,0.0);
      if (_local_848 != (aiVector2D)&local_838) {
        operator_delete((void *)_local_848);
      }
    }
    _local_848 = (aiVector2D)&local_838;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"Material","");
    pTabLevel_00 = local_888 + 1;
    NodeHelper_OpenNode(this,(string *)local_848,pTabLevel_00,true,
                        (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&local_930);
    if (_local_848 != (aiVector2D)&local_838) {
      operator_delete((void *)_local_848);
    }
    std::__cxx11::
    _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    _M_clear(&local_930);
    local_930._M_impl._M_node._M_size = 0;
    _local_848 = (aiVector2D)((ulong)_local_848 & 0xffffff0000000000);
    local_930._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_930;
    local_930._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_930;
    local_918._0_8_ = (_List_node_base *)&local_930;
    memset(local_848 + 5,0x1b,0x3ff);
    aVar8 = aiGetMaterialString(pMat,"$tex.file",1,0,(aiString *)local_848);
    if (aVar8 == aiReturn_SUCCESS) {
      if (local_848[4] == '*') {
        aVar16 = (aiVector2D)&local_8c8.Name.field_2;
        local_8c8.Name._M_dataplus._M_p = (pointer)aVar16;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_8c8,"Embedded texture is not supported","");
        this_00 = DefaultLogger::get();
        Logger::error(this_00,local_8c8.Name._M_dataplus._M_p);
        aVar22 = (aiVector2D)local_8c8.Name._M_dataplus._M_p;
      }
      else {
        local_8c8.Name._M_dataplus._M_p = (pointer)&local_8c8.Name.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_8c8,"url","");
        local_8e8._0_8_ = local_8d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_8e8,"\"","");
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_8e8);
        local_908 = (undefined1  [8])local_8f8;
        pXVar21 = (X3DExporter *)(plVar12 + 2);
        if ((X3DExporter *)*plVar12 == pXVar21) {
          local_8f8._0_8_ = pXVar21->mScene;
          local_8f8._8_8_ = plVar12[3];
        }
        else {
          local_8f8._0_8_ = pXVar21->mScene;
          local_908 = (undefined1  [8])*plVar12;
        }
        plStack_900 = (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)plVar12[1];
        *plVar12 = (long)pXVar21;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::append(local_908);
        paVar4 = &local_8c8.Value.field_2;
        psVar14 = (size_type *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar14) {
          local_8c8.Value.field_2._M_allocated_capacity = *psVar14;
          local_8c8.Value.field_2._8_8_ = plVar12[3];
          local_8c8.Value._M_dataplus._M_p = (pointer)paVar4;
        }
        else {
          local_8c8.Value.field_2._M_allocated_capacity = *psVar14;
          local_8c8.Value._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_8c8.Value._M_string_length = plVar12[1];
        *plVar12 = (long)psVar14;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        p_Var10 = std::__cxx11::
                  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                  ::_M_create_node<Assimp::X3DExporter::SAttribute>
                            ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                              *)&local_930,&local_8c8);
        std::__detail::_List_node_base::_M_hook(&p_Var10->super__List_node_base);
        local_930._M_impl._M_node._M_size = local_930._M_impl._M_node._M_size + 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8c8.Value._M_dataplus._M_p != paVar4) {
          operator_delete(local_8c8.Value._M_dataplus._M_p);
        }
        aVar16 = (aiVector2D)local_8d8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8c8.Name._M_dataplus._M_p != &local_8c8.Name.field_2) {
          operator_delete(local_8c8.Name._M_dataplus._M_p);
        }
        aVar22 = (aiVector2D)local_8e8._0_8_;
        if (local_908 != (undefined1  [8])local_8f8) {
          operator_delete((void *)local_908);
          aVar22 = (aiVector2D)local_8e8._0_8_;
        }
      }
      if (aVar22 != aVar16) {
        operator_delete((void *)aVar22);
      }
    }
    bVar23 = 0;
    aVar8 = aiGetMaterialProperty(pMat,"$tex.mapmodeu",1,0,(aiMaterialProperty **)&local_8c8);
    if (((aVar8 == aiReturn_SUCCESS) &&
        (*(int *)((long)local_8c8.Name._M_dataplus._M_p + 0x40c) != 0)) &&
       (*(int *)((long)local_8c8.Name._M_dataplus._M_p + 0x410) == 5)) {
      bVar23 = **(byte **)(local_8c8.Name._M_dataplus._M_p + 0x418);
      bVar6 = true;
    }
    else {
      bVar6 = false;
    }
    paVar4 = &local_8c8.Name.field_2;
    if (bVar6) {
      local_8c8.Name._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_8c8,"repeatS","");
      Export_Material::anon_class_8_1_15d7a4cc::operator()
                ((anon_class_8_1_15d7a4cc *)&local_918,&local_8c8.Name,(bool)(bVar23 & 1));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8c8.Name._M_dataplus._M_p != paVar4) {
        operator_delete(local_8c8.Name._M_dataplus._M_p);
      }
    }
    aVar8 = aiGetMaterialProperty(pMat,"$tex.mapmodev",1,0,(aiMaterialProperty **)&local_8c8);
    if (((aVar8 == aiReturn_SUCCESS) &&
        (*(int *)((long)local_8c8.Name._M_dataplus._M_p + 0x40c) != 0)) &&
       (*(int *)((long)local_8c8.Name._M_dataplus._M_p + 0x410) == 5)) {
      bVar23 = **(byte **)(local_8c8.Name._M_dataplus._M_p + 0x418);
      bVar6 = true;
    }
    else {
      bVar6 = false;
    }
    if (bVar6) {
      local_8c8.Name._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_8c8,"repeatT","");
      Export_Material::anon_class_8_1_15d7a4cc::operator()
                ((anon_class_8_1_15d7a4cc *)&local_918,&local_8c8.Name,(bool)(bVar23 & 1));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8c8.Name._M_dataplus._M_p != paVar4) {
        operator_delete(local_8c8.Name._M_dataplus._M_p);
      }
    }
    local_8c8.Name._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_8c8,"ImageTexture","");
    NodeHelper_OpenNode(this,&local_8c8.Name,pTabLevel_00,true,
                        (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&local_930);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8c8.Name._M_dataplus._M_p != paVar4) {
      operator_delete(local_8c8.Name._M_dataplus._M_p);
    }
    std::__cxx11::
    _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    _M_clear(&local_930);
    local_930._M_impl._M_node._M_size = 0;
    local_8c8.Name._M_dataplus._M_p = (pointer)0x0;
    local_8c8.Name._M_string_length = 0x3f8000003f800000;
    local_8c8.Name.field_2._M_allocated_capacity._0_4_ = 0.0;
    local_930._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_930;
    local_930._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_930;
    local_908 = (undefined1  [8])this;
    plStack_900 = (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                   *)&local_930;
    aVar8 = aiGetMaterialUVTransform(pMat,"$tex.uvtrafo",1,0,(aiUVTransform *)&local_8c8);
    if (aVar8 == aiReturn_SUCCESS) {
      _local_848 = (aiVector2D)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"translation","");
      local_8e8.r = 0.0;
      local_8e8.g = 0.0;
      Export_Material::anon_class_16_2_65aab299::operator()
                ((anon_class_16_2_65aab299 *)local_908,(string *)local_848,(aiVector2D *)&local_8c8,
                 (aiVector2D *)&local_8e8);
      if (_local_848 != (aiVector2D)&local_838) {
        operator_delete((void *)_local_848);
      }
      pXVar21 = (X3DExporter *)local_848;
      _local_848 = (aiVector2D)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)pXVar21,"rotation","");
      AttrHelper_FloatToAttrList
                (pXVar21,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_930,(string *)local_848,
                 (float)local_8c8.Name.field_2._M_allocated_capacity._0_4_,0.0);
      if (_local_848 != (aiVector2D)&local_838) {
        operator_delete((void *)_local_848);
      }
      _local_848 = (aiVector2D)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"scale","");
      local_8e8.r = 1.0;
      local_8e8.g = 1.0;
      Export_Material::anon_class_16_2_65aab299::operator()
                ((anon_class_16_2_65aab299 *)local_908,(string *)local_848,
                 (aiVector2D *)&local_8c8.Name._M_string_length,(aiVector2D *)&local_8e8);
      if (_local_848 != (aiVector2D)&local_838) {
        operator_delete((void *)_local_848);
      }
      _local_848 = (aiVector2D)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"TextureTransform","");
      NodeHelper_OpenNode(this,(string *)local_848,pTabLevel_00,true,
                          (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                           *)&local_930);
      if (_local_848 != (aiVector2D)&local_838) {
        operator_delete((void *)_local_848);
      }
      std::__cxx11::
      _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
      ::_M_clear(&local_930);
      local_930._M_impl._M_node._M_size = 0;
      local_930._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_930;
      local_930._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_930;
    }
    _local_848 = (aiVector2D)&local_838;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"Appearance","");
    NodeHelper_CloseNode(this,(string *)local_848,local_888);
    if (_local_848 != (aiVector2D)&local_838) {
      operator_delete((void *)_local_848);
    }
    _Var20._M_p = local_868._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_868._M_p == &local_858) goto LAB_006d5533;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"USE","");
    pmVar9 = std::
             map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(&this->mDEF_Map_Material,(key_type_conflict1 *)&local_880);
    pcVar5 = (pmVar9->_M_dataplus)._M_p;
    local_418._M_p = local_408;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_418,pcVar5,pcVar5 + pmVar9->_M_string_length);
    p_Var10 = std::__cxx11::
              list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
              ::_M_create_node<Assimp::X3DExporter::SAttribute>
                        ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_930,(SAttribute *)local_438);
    std::__detail::_List_node_base::_M_hook(&p_Var10->super__List_node_base);
    local_930._M_impl._M_node._M_size = local_930._M_impl._M_node._M_size + 1;
    if (local_418._M_p != local_408) {
      operator_delete(local_418._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._0_8_ != paVar4) {
      operator_delete((void *)local_438._0_8_);
    }
    local_438._0_8_ = paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"Appearance","");
    NodeHelper_OpenNode(this,(string *)local_438,pTabLevel,true,
                        (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&local_930);
    _Var20._M_p = (pointer)local_438._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._0_8_ == paVar4) goto LAB_006d5533;
  }
  operator_delete(_Var20._M_p);
LAB_006d5533:
  std::__cxx11::
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
  _M_clear(&local_930);
  return;
}

Assistant:

void X3DExporter::Export_Material(const size_t pIdxMaterial, const size_t pTabLevel)
{
const char* NodeName_A = "Appearance";

list<SAttribute> attr_list;
aiMaterial& material = *mScene->mMaterials[pIdxMaterial];// create alias for conveniance.

	// Check if material already defined early.
	if(mDEF_Map_Material.find(pIdxMaterial) != mDEF_Map_Material.end())
	{
		// Material already defined, just refer to it
		attr_list.push_back({"USE", mDEF_Map_Material.at(pIdxMaterial)});
		NodeHelper_OpenNode(NodeName_A, pTabLevel, true, attr_list);

		return;
	}

	string material_name(string("_IDX_") + to_string(pIdxMaterial));// Create material name
	aiString ai_mat_name;

	if(material.Get(AI_MATKEY_NAME, ai_mat_name) == AI_SUCCESS) material_name.insert(0, ai_mat_name.C_Str());

	// Define material name.
	attr_list.push_back({"DEF", material_name});
	mDEF_Map_Material[pIdxMaterial] = material_name;

	//
	// "Appearance" node.
	//
	NodeHelper_OpenNode(NodeName_A, pTabLevel, false, attr_list);
	attr_list.clear();

	//
	// "Material" node.
	//
	{
		auto Color4ToAttrList = [&](const string& pAttrName, const aiColor4D& pAttrValue, const aiColor3D& pAttrDefaultValue)
		{
			string tstr;

			if(aiColor3D(pAttrValue.r, pAttrValue.g, pAttrValue.b) != pAttrDefaultValue)
			{
				AttrHelper_Col4DArrToString(&pAttrValue, 1, tstr);
				attr_list.push_back({pAttrName, tstr});
			}
		};

		float tvalf;
		aiColor3D color3;
		aiColor4D color4;

		// ambientIntensity="0.2"     SFFloat [inputOutput]
		if(material.Get(AI_MATKEY_COLOR_AMBIENT, color3) == AI_SUCCESS)
			AttrHelper_FloatToAttrList(attr_list, "ambientIntensity", (color3.r + color3.g + color3.b) / 3.0f, 0.2f);
		else if(material.Get(AI_MATKEY_COLOR_AMBIENT, color4) == AI_SUCCESS)
			AttrHelper_FloatToAttrList(attr_list, "ambientIntensity", (color4.r + color4.g + color4.b) / 3.0f, 0.2f);

		// diffuseColor="0.8 0.8 0.8" SFColor [inputOutput]
		if(material.Get(AI_MATKEY_COLOR_DIFFUSE, color3) == AI_SUCCESS)
			AttrHelper_Color3ToAttrList(attr_list, "diffuseColor", color3, aiColor3D(0.8f, 0.8f, 0.8f));
		else if(material.Get(AI_MATKEY_COLOR_DIFFUSE, color4) == AI_SUCCESS)
			Color4ToAttrList("diffuseColor", color4, aiColor3D(0.8f, 0.8f, 0.8f));

		// emissiveColor="0 0 0"      SFColor [inputOutput]
		if(material.Get(AI_MATKEY_COLOR_EMISSIVE, color3) == AI_SUCCESS)
			AttrHelper_Color3ToAttrList(attr_list, "emissiveColor", color3, aiColor3D(0, 0, 0));
		else if(material.Get(AI_MATKEY_COLOR_EMISSIVE, color4) == AI_SUCCESS)
			Color4ToAttrList("emissiveColor", color4, aiColor3D(0, 0, 0));

		// shininess="0.2"            SFFloat [inputOutput]
		if(material.Get(AI_MATKEY_SHININESS, tvalf) == AI_SUCCESS) AttrHelper_FloatToAttrList(attr_list, "shininess", tvalf, 0.2f);

		// specularColor="0 0 0"      SFColor [inputOutput]
		if(material.Get(AI_MATKEY_COLOR_SPECULAR, color3) == AI_SUCCESS)
			AttrHelper_Color3ToAttrList(attr_list, "specularColor", color3, aiColor3D(0, 0, 0));
		else if(material.Get(AI_MATKEY_COLOR_SPECULAR, color4) == AI_SUCCESS)
			Color4ToAttrList("specularColor", color4, aiColor3D(0, 0, 0));

		// transparency="0"           SFFloat [inputOutput]
		if(material.Get(AI_MATKEY_OPACITY, tvalf) == AI_SUCCESS)
		{
			if(tvalf > 1) tvalf = 1;

			tvalf = 1.0f - tvalf;
			AttrHelper_FloatToAttrList(attr_list, "transparency", tvalf, 0);
		}

		NodeHelper_OpenNode("Material", pTabLevel + 1, true, attr_list);
		attr_list.clear();
	}// "Material" node. END.

	//
	// "ImageTexture" node.
	//
	{
		auto RepeatToAttrList = [&](const string& pAttrName, const bool pAttrValue)
		{
			if(!pAttrValue) attr_list.push_back({pAttrName, "false"});
		};

		bool tvalb;
		aiString tstring;

		// url=""         MFString
		if(material.Get(AI_MATKEY_TEXTURE_DIFFUSE(0), tstring) == AI_SUCCESS)
		{
			if(strncmp(tstring.C_Str(), AI_EMBEDDED_TEXNAME_PREFIX, strlen(AI_EMBEDDED_TEXNAME_PREFIX)) == 0)
				LogError("Embedded texture is not supported");
			else
				attr_list.push_back({"url", string("\"") + tstring.C_Str() + "\""});
		}

		// repeatS="true" SFBool
		if(material.Get(AI_MATKEY_MAPPINGMODE_U_DIFFUSE(0), tvalb) == AI_SUCCESS) RepeatToAttrList("repeatS", tvalb);

		// repeatT="true" SFBool
		if(material.Get(AI_MATKEY_MAPPINGMODE_V_DIFFUSE(0), tvalb) == AI_SUCCESS) RepeatToAttrList("repeatT", tvalb);

		NodeHelper_OpenNode("ImageTexture", pTabLevel + 1, true, attr_list);
		attr_list.clear();
	}// "ImageTexture" node. END.

	//
	// "TextureTransform" node.
	//
	{
		auto Vec2ToAttrList = [&](const string& pAttrName, const aiVector2D& pAttrValue, const aiVector2D& pAttrDefaultValue)
		{
			string tstr;

			if(pAttrValue != pAttrDefaultValue)
			{
				AttrHelper_Vec2DArrToString(&pAttrValue, 1, tstr);
				attr_list.push_back({pAttrName, tstr});
			}
		};

		aiUVTransform transform;

		if(material.Get(AI_MATKEY_UVTRANSFORM_DIFFUSE(0), transform) == AI_SUCCESS)
		{
			Vec2ToAttrList("translation", transform.mTranslation, aiVector2D(0, 0));
			AttrHelper_FloatToAttrList(attr_list, "rotation", transform.mRotation, 0);
			Vec2ToAttrList("scale", transform.mScaling, aiVector2D(1, 1));

			NodeHelper_OpenNode("TextureTransform", pTabLevel + 1, true, attr_list);
			attr_list.clear();
		}
	}// "TextureTransform" node. END.

	//
	// Close opened nodes.
	//
	NodeHelper_CloseNode(NodeName_A, pTabLevel);

}